

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS2fstreamMPI.cpp
# Opt level: O1

int __thiscall adios2::fstream::open(fstream *this,char *__file,int __oflag,...)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Stream *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined1 local_51;
  ompi_communicator_t local_50 [8];
  Stream *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  Mode local_34;
  
  adios2::fstream::CheckOpen((string *)this);
  local_34 = adios2::fstream::ToMode((openmode)this);
  adios2::helper::CommDupMPI(local_50);
  local_48 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<adios2::core::Stream,std::allocator<adios2::core::Stream>,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,std::__cxx11::string_const&,char_const(&)[4]>
            (&_Stack_40,&local_48,(allocator<adios2::core::Stream> *)&local_51,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__file,&local_34,
             (Comm *)local_50,in_R8,(char (*) [4])"C++");
  _Var2._M_pi = _Stack_40._M_pi;
  pSVar1 = local_48;
  local_48 = (Stream *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_Stream).super___shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_Stream).super___shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pSVar1;
  (this->m_Stream).super___shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  iVar3 = adios2::helper::Comm::~Comm((Comm *)local_50);
  return iVar3;
}

Assistant:

void fstream::open(const std::string &name, const openmode mode, MPI_Comm comm,
                   const std::string engineType)
{
    CheckOpen(name);
    m_Stream = std::make_shared<core::Stream>(name, ToMode(mode), helper::CommDupMPI(comm),
                                              engineType, "C++");
}